

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O0

void __thiscall
helics::FilterInfo::addDestinationEndpoint
          (FilterInfo *this,GlobalHandle dest,string_view destName,string_view destType)

{
  bool bVar1;
  iterator this_00;
  reference __args;
  size_type in_RSI;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  *in_RDI;
  EptInformation *ti_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *__range1_1;
  EptInformation *ti;
  iterator __end1;
  iterator __begin1;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *__range1;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *in_stack_ffffffffffffff78
  ;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  GlobalHandle in_stack_ffffffffffffff90;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  in_stack_ffffffffffffff98;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *in_stack_ffffffffffffffa0
  ;
  size_type in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_40;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  *local_38;
  size_type local_8;
  
  local_38 = in_RDI + 0x19;
  local_8 = in_RSI;
  local_40._M_current =
       (EptInformation *)
       std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                 (in_stack_ffffffffffffff78);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
            (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                      (in_RDI,(__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                               *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                (in_stack_ffffffffffffffa0,&(in_stack_ffffffffffffff98._M_current)->id,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      this_01 = (vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                (in_RDI + 0x10);
      std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::size
                ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                 (in_RDI + 0x19));
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::reserve
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x6ab184);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6ab195);
      std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin(this_01);
      this_00 = std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
                          (this_01);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                               (in_RDI,(__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                                        *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
        __args = __gnu_cxx::
                 __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                 ::operator*((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                              *)&stack0xffffffffffffff98);
        std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
        emplace_back<helics::GlobalHandle_const&>
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                   this_00._M_current,&__args->id);
        __gnu_cxx::
        __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
        ::operator++((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                      *)&stack0xffffffffffffff98);
      }
      return;
    }
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
         ::operator*(&local_40);
    in_stack_ffffffffffffffa8 = local_8;
    bVar1 = GlobalHandle::operator==
                      ((GlobalHandle *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void FilterInfo::addDestinationEndpoint(GlobalHandle dest,
                                        std::string_view destName,
                                        std::string_view destType)
{
    for (const auto& ti : destEndpoints) {
        if (ti.id == dest) {
            return;
        }
    }
    destEndpoints.emplace_back(dest, destName, destType);
    /** now update the target information*/
    destTargets.reserve(destEndpoints.size());
    destTargets.clear();
    destEpts.clear();
    for (const auto& ti : destEndpoints) {
        destTargets.emplace_back(ti.id);
    }
}